

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O3

int run_test_spawn_closed_process_io(void)

{
  int iVar1;
  __uid_t _Var2;
  uint uVar3;
  int extraout_EAX;
  undefined8 uVar4;
  anon_union_8_2_13e1ed65_for_data aVar5;
  uv_exit_cb p_Var6;
  uv_process_options_t *__nmemb;
  passwd *ppVar7;
  uv_process_options_t *puVar8;
  int *piVar9;
  uv_process_options_t *puVar10;
  uv_buf_t *buf;
  undefined1 *nread;
  uv_stream_t *tcp;
  char *unaff_R12;
  uv_process_options_t *__s;
  uv_process_options_t *unaff_R15;
  undefined1 auVar11 [16];
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  uv_stdio_container_t stdio [2];
  uv_write_t write_req;
  uv_pipe_t in;
  undefined1 auStack_c00 [48];
  uv_handle_t *apuStack_bd0 [11];
  uv_loop_t *puStack_b78;
  undefined8 auStack_a10 [29];
  uv_stdio_container_t uStack_928;
  undefined4 uStack_918;
  undefined4 uStack_908;
  uv_process_options_t *puStack_8f0;
  long lStack_8b8;
  uint uStack_8b0;
  int iStack_8ac;
  undefined1 auStack_8a8 [16];
  undefined8 uStack_898;
  undefined2 uStack_890;
  uv_stdio_container_t uStack_888;
  long alStack_870 [25];
  long alStack_7a8 [25];
  long alStack_6e0 [29];
  undefined1 auStack_5f8 [88];
  uint uStack_5a0;
  uv_process_options_t *puStack_438;
  uv_process_options_t *puStack_430;
  uv_process_options_t *puStack_428;
  long lStack_420;
  long lStack_418;
  uv_process_options_t *puStack_410;
  char cStack_3f9;
  long lStack_3f8;
  long lStack_3f0;
  uv_process_options_t *puStack_3e8;
  uv_process_options_t *puStack_3e0;
  uv_process_options_t *apuStack_3d8 [2];
  uv_process_options_t *puStack_3c8;
  cpu_set_t cStack_3c0;
  uv_process_options_t *puStack_338;
  char *pcStack_330;
  uv_process_options_t *puStack_328;
  uv_process_options_t *puStack_320;
  long lStack_318;
  long lStack_310;
  uv_process_options_t *puStack_308;
  long lStack_300;
  long lStack_2f8;
  uv_process_options_t *puStack_2f0;
  long lStack_2e8;
  long lStack_2e0;
  char acStack_2ca [10];
  uv_process_options_t *puStack_2c0;
  sigset_t sStack_290;
  anon_union_8_2_13e1ed65_for_data aStack_210;
  long local_208;
  long local_200;
  undefined1 local_1f8 [16];
  uv_stdio_container_t local_1e8 [2];
  long local_1c0 [25];
  undefined1 local_f8 [232];
  
  aStack_210 = (anon_union_8_2_13e1ed65_for_data)0x1c1c34;
  init_process_options("spawn_helper3",exit_cb);
  aStack_210 = (anon_union_8_2_13e1ed65_for_data)0x1c1c39;
  uVar4 = uv_default_loop();
  aVar5.stream = (uv_stream_t *)local_f8;
  aStack_210 = (anon_union_8_2_13e1ed65_for_data)0x1c1c4e;
  uv_pipe_init(uVar4,aVar5.stream,0);
  options.stdio = local_1e8;
  __s = &options;
  local_1e8[0].flags = UV_READABLE_PIPE|UV_CREATE_PIPE;
  options.stdio_count = 1;
  aStack_210 = (anon_union_8_2_13e1ed65_for_data)0x1c1c7c;
  local_1e8[0].data.stream = aVar5.stream;
  close(0);
  aStack_210 = (anon_union_8_2_13e1ed65_for_data)0x1c1c81;
  uVar4 = uv_default_loop();
  aStack_210 = (anon_union_8_2_13e1ed65_for_data)0x1c1c93;
  iVar1 = uv_spawn(uVar4,&process,&options);
  local_1c0[0] = (long)iVar1;
  local_1f8._0_8_ = 0;
  if (local_1c0[0] == 0) {
    aStack_210 = (anon_union_8_2_13e1ed65_for_data)0x1c1cc4;
    local_1f8 = uv_buf_init(run_test_spawn_closed_process_io::buffer,0x18);
    aStack_210 = (anon_union_8_2_13e1ed65_for_data)0x1c1cf1;
    iVar1 = uv_write(local_1c0,local_f8,local_1f8,1,write_cb);
    local_200 = (long)iVar1;
    local_208 = 0;
    if (local_200 != 0) goto LAB_001c1ded;
    aStack_210 = (anon_union_8_2_13e1ed65_for_data)0x1c1d14;
    uVar4 = uv_default_loop();
    aStack_210 = (anon_union_8_2_13e1ed65_for_data)0x1c1d1e;
    iVar1 = uv_run(uVar4,0);
    local_200 = (long)iVar1;
    local_208 = 0;
    if (local_200 != 0) goto LAB_001c1dfa;
    local_200 = 1;
    local_208 = (long)exit_cb_called;
    if (local_208 != 1) goto LAB_001c1e07;
    local_200 = 2;
    local_208 = (long)close_cb_called;
    if (local_208 != 2) goto LAB_001c1e14;
    aStack_210 = (anon_union_8_2_13e1ed65_for_data)0x1c1d87;
    aVar5.stream = (uv_stream_t *)uv_default_loop();
    aStack_210 = (anon_union_8_2_13e1ed65_for_data)0x1c1d9b;
    uv_walk(aVar5.stream,close_walk_cb,0);
    aStack_210 = (anon_union_8_2_13e1ed65_for_data)0x1c1da5;
    uv_run(aVar5.stream,0);
    local_200 = 0;
    aStack_210 = (anon_union_8_2_13e1ed65_for_data)0x1c1db3;
    uVar4 = uv_default_loop();
    aStack_210 = (anon_union_8_2_13e1ed65_for_data)0x1c1dbb;
    iVar1 = uv_loop_close(uVar4);
    local_208 = (long)iVar1;
    if (local_200 == local_208) {
      aStack_210 = (anon_union_8_2_13e1ed65_for_data)0x1c1dd1;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    aStack_210 = (anon_union_8_2_13e1ed65_for_data)0x1c1ded;
    run_test_spawn_closed_process_io_cold_1();
LAB_001c1ded:
    aStack_210 = (anon_union_8_2_13e1ed65_for_data)0x1c1dfa;
    run_test_spawn_closed_process_io_cold_2();
LAB_001c1dfa:
    aStack_210 = (anon_union_8_2_13e1ed65_for_data)0x1c1e07;
    run_test_spawn_closed_process_io_cold_3();
LAB_001c1e07:
    aStack_210 = (anon_union_8_2_13e1ed65_for_data)0x1c1e14;
    run_test_spawn_closed_process_io_cold_4();
LAB_001c1e14:
    aStack_210 = (anon_union_8_2_13e1ed65_for_data)0x1c1e21;
    run_test_spawn_closed_process_io_cold_5();
  }
  aStack_210.stream = (uv_stream_t *)run_test_kill;
  run_test_spawn_closed_process_io_cold_6();
  aStack_210 = aVar5;
  init_process_options("spawn_helper4",kill_cb);
  sigemptyset(&sStack_290);
  sigaddset(&sStack_290,0xf);
  iVar1 = pthread_sigmask(0,&sStack_290,(__sigset_t *)0x0);
  if (iVar1 == 0) {
    sStack_290.__val[0] = 0xffffffffffffffff;
    p_Var6 = (uv_exit_cb)signal(0xf,(__sighandler_t)0x1);
    if ((uv_exit_cb)sStack_290.__val[0] == p_Var6) goto LAB_001c2097;
    uVar4 = uv_default_loop();
    iVar1 = uv_spawn(uVar4,&process,&options);
    sStack_290.__val[0] = (ulong)iVar1;
    if ((uv_exit_cb)sStack_290.__val[0] != (uv_exit_cb)0x0) goto LAB_001c20a4;
    sigemptyset(&sStack_290);
    sigaddset(&sStack_290,0xf);
    iVar1 = pthread_sigmask(1,&sStack_290,(__sigset_t *)0x0);
    if (iVar1 != 0) goto LAB_001c20b1;
    sStack_290.__val[0] = 0xffffffffffffffff;
    p_Var6 = (uv_exit_cb)signal(0xf,(__sighandler_t)0x0);
    if ((uv_exit_cb)sStack_290.__val[0] == p_Var6) goto LAB_001c20be;
    iVar1 = uv_kill(process.pid,0);
    sStack_290.__val[0] = (ulong)iVar1;
    if ((uv_exit_cb)sStack_290.__val[0] != (uv_exit_cb)0x0) goto LAB_001c20cb;
    iVar1 = uv_kill(process.pid,0xf);
    sStack_290.__val[0] = (ulong)iVar1;
    if ((uv_exit_cb)sStack_290.__val[0] != (uv_exit_cb)0x0) goto LAB_001c20d8;
    uVar4 = uv_default_loop();
    iVar1 = uv_run(uVar4,0);
    sStack_290.__val[0] = (ulong)iVar1;
    if ((uv_exit_cb)sStack_290.__val[0] != (uv_exit_cb)0x0) goto LAB_001c20e5;
    sStack_290.__val[0] = 1;
    if (exit_cb_called != 1) goto LAB_001c20f2;
    sStack_290.__val[0] = 1;
    if (close_cb_called != 1) goto LAB_001c20ff;
    __nmemb = (uv_process_options_t *)uv_default_loop();
    uv_walk(__nmemb,close_walk_cb,0);
    uv_run(__nmemb,0);
    sStack_290.__val[0] = 0;
    uVar4 = uv_default_loop();
    iVar1 = uv_loop_close(uVar4);
    if ((uv_exit_cb)sStack_290.__val[0] == (uv_exit_cb)(long)iVar1) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_kill_cold_1();
LAB_001c2097:
    run_test_kill_cold_11();
LAB_001c20a4:
    run_test_kill_cold_2();
LAB_001c20b1:
    run_test_kill_cold_3();
LAB_001c20be:
    run_test_kill_cold_10();
LAB_001c20cb:
    run_test_kill_cold_4();
LAB_001c20d8:
    run_test_kill_cold_5();
LAB_001c20e5:
    run_test_kill_cold_6();
LAB_001c20f2:
    run_test_kill_cold_7();
LAB_001c20ff:
    __nmemb = (uv_process_options_t *)&sStack_290;
    run_test_kill_cold_8();
  }
  run_test_kill_cold_9();
  puStack_2f0 = (uv_process_options_t *)0x1c2129;
  puStack_2c0 = __nmemb;
  _Var2 = getuid();
  if (_Var2 != 0) {
    puStack_2f0 = (uv_process_options_t *)0x1c22e8;
    run_test_spawn_setuid_setgid_cold_1();
    return 7;
  }
  puStack_2f0 = (uv_process_options_t *)0x1c2144;
  init_process_options("spawn_helper_setuid_setgid",exit_cb);
  puStack_2f0 = (uv_process_options_t *)0x1c2150;
  ppVar7 = getpwnam("nobody");
  if (ppVar7 == (passwd *)0x0) {
    puStack_2f0 = (uv_process_options_t *)0x1c22fb;
    run_test_spawn_setuid_setgid_cold_8();
LAB_001c22fb:
    puStack_2f0 = (uv_process_options_t *)0x1c2308;
    run_test_spawn_setuid_setgid_cold_2();
LAB_001c2308:
    puStack_2f0 = (uv_process_options_t *)0x1c2315;
    run_test_spawn_setuid_setgid_cold_3();
LAB_001c2315:
    puStack_2f0 = (uv_process_options_t *)0x1c2322;
    run_test_spawn_setuid_setgid_cold_4();
LAB_001c2322:
    puStack_2f0 = (uv_process_options_t *)0x1c232f;
    run_test_spawn_setuid_setgid_cold_5();
  }
  else {
    options.uid = ppVar7->pw_uid;
    __nmemb = &options;
    options.gid = ppVar7->pw_gid;
    unaff_R15 = (uv_process_options_t *)0x1e6b28;
    unaff_R12 = acStack_2ca;
    puStack_2f0 = (uv_process_options_t *)0x1c2198;
    snprintf(unaff_R12,10,"%d",(ulong)ppVar7->pw_uid);
    __s = (uv_process_options_t *)&stack0xfffffffffffffd2c;
    puStack_2f0 = (uv_process_options_t *)0x1c21b3;
    snprintf((char *)__s,10,"%d",(ulong)ppVar7->pw_gid);
    options.args[2] = unaff_R12;
    options.args[3] = (char *)__s;
    options.flags = 3;
    puStack_2f0 = (uv_process_options_t *)0x1c21d8;
    uVar4 = uv_default_loop();
    puStack_2f0 = (uv_process_options_t *)0x1c21ea;
    iVar1 = uv_spawn(uVar4,&process,&options);
    if (iVar1 == -0xd) {
      puStack_2f0 = (uv_process_options_t *)0x1c22ef;
      run_test_spawn_setuid_setgid_cold_7();
      return 7;
    }
    lStack_2e0 = (long)iVar1;
    lStack_2e8 = 0;
    if (lStack_2e0 != 0) goto LAB_001c22fb;
    puStack_2f0 = (uv_process_options_t *)0x1c2216;
    uVar4 = uv_default_loop();
    puStack_2f0 = (uv_process_options_t *)0x1c2220;
    iVar1 = uv_run(uVar4,0);
    lStack_2e0 = (long)iVar1;
    lStack_2e8 = 0;
    if (lStack_2e0 != 0) goto LAB_001c2308;
    lStack_2e0 = 1;
    lStack_2e8 = (long)exit_cb_called;
    if (lStack_2e8 != 1) goto LAB_001c2315;
    lStack_2e0 = 1;
    lStack_2e8 = (long)close_cb_called;
    if (lStack_2e8 != 1) goto LAB_001c2322;
    puStack_2f0 = (uv_process_options_t *)0x1c2289;
    __s = (uv_process_options_t *)uv_default_loop();
    __nmemb = (uv_process_options_t *)0x0;
    puStack_2f0 = (uv_process_options_t *)0x1c229f;
    uv_walk(__s,close_walk_cb,0);
    puStack_2f0 = (uv_process_options_t *)0x1c22a9;
    uv_run(__s,0);
    lStack_2e0 = 0;
    puStack_2f0 = (uv_process_options_t *)0x1c22b7;
    uVar4 = uv_default_loop();
    puStack_2f0 = (uv_process_options_t *)0x1c22bf;
    iVar1 = uv_loop_close(uVar4);
    lStack_2e8 = (long)iVar1;
    if (lStack_2e0 == lStack_2e8) {
      puStack_2f0 = (uv_process_options_t *)0x1c22d5;
      uv_library_shutdown();
      return 0;
    }
  }
  puStack_2f0 = (uv_process_options_t *)run_test_spawn_setuid_fails;
  run_test_spawn_setuid_setgid_cold_6();
  puStack_308 = (uv_process_options_t *)0x1c2346;
  puStack_2f0 = __nmemb;
  _Var2 = getuid();
  if (_Var2 == 0) {
    puStack_308 = (uv_process_options_t *)0x1c2356;
    puVar8 = (uv_process_options_t *)getpwnam("nobody");
    if (puVar8 == (uv_process_options_t *)0x0) goto LAB_001c24e5;
    puStack_308 = (uv_process_options_t *)0x1c236a;
    iVar1 = setgid(*(__gid_t *)((long)&puVar8->args + 4));
    lStack_2f8 = (long)iVar1;
    lStack_300 = 0;
    __nmemb = puVar8;
    if (lStack_2f8 != 0) goto LAB_001c24ea;
    puStack_308 = (uv_process_options_t *)0x1c2390;
    iVar1 = setuid(*(__uid_t *)&puVar8->args);
    lStack_2f8 = (long)iVar1;
    lStack_300 = 0;
    if (lStack_2f8 == 0) goto LAB_001c23ae;
  }
  else {
LAB_001c23ae:
    puStack_308 = (uv_process_options_t *)0x1c23c1;
    init_process_options("spawn_helper1",fail_cb);
    __nmemb = &options;
    options.uid = 0;
    options.flags = options.flags | 0x75;
    puStack_308 = (uv_process_options_t *)0x1c23de;
    uVar4 = uv_default_loop();
    puStack_308 = (uv_process_options_t *)0x1c23f0;
    iVar1 = uv_spawn(uVar4,&process,&options);
    lStack_2f8 = (long)iVar1;
    lStack_300 = -1;
    if (lStack_2f8 == -1) {
      puStack_308 = (uv_process_options_t *)0x1c2413;
      uVar4 = uv_default_loop();
      puStack_308 = (uv_process_options_t *)0x1c241d;
      iVar1 = uv_run(uVar4,0);
      lStack_2f8 = (long)iVar1;
      lStack_300 = 0;
      if (lStack_2f8 != 0) goto LAB_001c24be;
      lStack_2f8 = (long)close_cb_called;
      lStack_300 = 0;
      if (lStack_2f8 != 0) goto LAB_001c24cb;
      puStack_308 = (uv_process_options_t *)0x1c245f;
      __nmemb = (uv_process_options_t *)uv_default_loop();
      puStack_308 = (uv_process_options_t *)0x1c2473;
      uv_walk(__nmemb,close_walk_cb,0);
      puStack_308 = (uv_process_options_t *)0x1c247d;
      uv_run(__nmemb,0);
      lStack_2f8 = 0;
      puStack_308 = (uv_process_options_t *)0x1c248b;
      uVar4 = uv_default_loop();
      puStack_308 = (uv_process_options_t *)0x1c2493;
      iVar1 = uv_loop_close(uVar4);
      lStack_300 = (long)iVar1;
      if (lStack_2f8 == lStack_300) {
        puStack_308 = (uv_process_options_t *)0x1c24a9;
        uv_library_shutdown();
        return 0;
      }
    }
    else {
      puStack_308 = (uv_process_options_t *)0x1c24be;
      run_test_spawn_setuid_fails_cold_3();
LAB_001c24be:
      puStack_308 = (uv_process_options_t *)0x1c24cb;
      run_test_spawn_setuid_fails_cold_4();
LAB_001c24cb:
      puStack_308 = (uv_process_options_t *)0x1c24d8;
      run_test_spawn_setuid_fails_cold_5();
    }
    puStack_308 = (uv_process_options_t *)0x1c24e5;
    run_test_spawn_setuid_fails_cold_6();
LAB_001c24e5:
    puStack_308 = (uv_process_options_t *)0x1c24ea;
    run_test_spawn_setuid_fails_cold_7();
LAB_001c24ea:
    puStack_308 = (uv_process_options_t *)0x1c24f7;
    run_test_spawn_setuid_fails_cold_1();
  }
  puStack_308 = (uv_process_options_t *)run_test_spawn_setgid_fails;
  run_test_spawn_setuid_fails_cold_2();
  puStack_320 = (uv_process_options_t *)0x1c250e;
  puStack_308 = __nmemb;
  _Var2 = getuid();
  if (_Var2 == 0) {
    puStack_320 = (uv_process_options_t *)0x1c251e;
    puVar8 = (uv_process_options_t *)getpwnam("nobody");
    if (puVar8 == (uv_process_options_t *)0x0) goto LAB_001c26ad;
    puStack_320 = (uv_process_options_t *)0x1c2532;
    iVar1 = setgid(*(__gid_t *)((long)&puVar8->args + 4));
    lStack_310 = (long)iVar1;
    lStack_318 = 0;
    __nmemb = puVar8;
    if (lStack_310 != 0) goto LAB_001c26b2;
    puStack_320 = (uv_process_options_t *)0x1c2558;
    iVar1 = setuid(*(__uid_t *)&puVar8->args);
    lStack_310 = (long)iVar1;
    lStack_318 = 0;
    if (lStack_310 == 0) goto LAB_001c2576;
  }
  else {
LAB_001c2576:
    puStack_320 = (uv_process_options_t *)0x1c2589;
    init_process_options("spawn_helper1",fail_cb);
    __nmemb = &options;
    options.flags = options.flags | 2;
    options.gid = 0;
    puStack_320 = (uv_process_options_t *)0x1c25a6;
    uVar4 = uv_default_loop();
    puStack_320 = (uv_process_options_t *)0x1c25b8;
    iVar1 = uv_spawn(uVar4,&process,&options);
    lStack_310 = (long)iVar1;
    lStack_318 = -1;
    if (lStack_310 == -1) {
      puStack_320 = (uv_process_options_t *)0x1c25db;
      uVar4 = uv_default_loop();
      puStack_320 = (uv_process_options_t *)0x1c25e5;
      iVar1 = uv_run(uVar4,0);
      lStack_310 = (long)iVar1;
      lStack_318 = 0;
      if (lStack_310 != 0) goto LAB_001c2686;
      lStack_310 = (long)close_cb_called;
      lStack_318 = 0;
      if (lStack_310 != 0) goto LAB_001c2693;
      puStack_320 = (uv_process_options_t *)0x1c2627;
      __nmemb = (uv_process_options_t *)uv_default_loop();
      puStack_320 = (uv_process_options_t *)0x1c263b;
      uv_walk(__nmemb,close_walk_cb,0);
      puStack_320 = (uv_process_options_t *)0x1c2645;
      uv_run(__nmemb,0);
      lStack_310 = 0;
      puStack_320 = (uv_process_options_t *)0x1c2653;
      uVar4 = uv_default_loop();
      puStack_320 = (uv_process_options_t *)0x1c265b;
      iVar1 = uv_loop_close(uVar4);
      lStack_318 = (long)iVar1;
      if (lStack_310 == lStack_318) {
        puStack_320 = (uv_process_options_t *)0x1c2671;
        uv_library_shutdown();
        return 0;
      }
    }
    else {
      puStack_320 = (uv_process_options_t *)0x1c2686;
      run_test_spawn_setgid_fails_cold_3();
LAB_001c2686:
      puStack_320 = (uv_process_options_t *)0x1c2693;
      run_test_spawn_setgid_fails_cold_4();
LAB_001c2693:
      puStack_320 = (uv_process_options_t *)0x1c26a0;
      run_test_spawn_setgid_fails_cold_5();
    }
    puStack_320 = (uv_process_options_t *)0x1c26ad;
    run_test_spawn_setgid_fails_cold_6();
LAB_001c26ad:
    puStack_320 = (uv_process_options_t *)0x1c26b2;
    run_test_spawn_setgid_fails_cold_7();
LAB_001c26b2:
    puStack_320 = (uv_process_options_t *)0x1c26bf;
    run_test_spawn_setgid_fails_cold_1();
  }
  puStack_320 = (uv_process_options_t *)run_test_spawn_affinity;
  run_test_spawn_setgid_fails_cold_2();
  puStack_3e8 = (uv_process_options_t *)0x1c26df;
  puStack_338 = __nmemb;
  pcStack_330 = unaff_R12;
  puStack_328 = __s;
  puStack_320 = unaff_R15;
  uVar3 = uv_cpumask_size();
  if ((int)uVar3 < 1) {
    puStack_3e8 = (uv_process_options_t *)0x1c28c8;
    run_test_spawn_affinity_cold_1();
LAB_001c28c8:
    puStack_3e8 = (uv_process_options_t *)0x1c28d5;
    run_test_spawn_affinity_cold_2();
LAB_001c28d5:
    puStack_3e8 = (uv_process_options_t *)0x1c28e2;
    run_test_spawn_affinity_cold_3();
    puVar8 = __nmemb;
LAB_001c28e2:
    puVar10 = __s;
    puStack_3e8 = (uv_process_options_t *)0x1c28e7;
    run_test_spawn_affinity_cold_9();
LAB_001c28e7:
    puStack_3e8 = (uv_process_options_t *)0x1c28ec;
    run_test_spawn_affinity_cold_4();
LAB_001c28ec:
    puStack_3e8 = (uv_process_options_t *)0x1c28f1;
    run_test_spawn_affinity_cold_5();
LAB_001c28f1:
    puStack_3e8 = (uv_process_options_t *)0x1c28f6;
    run_test_spawn_affinity_cold_6();
LAB_001c28f6:
    puStack_3e8 = (uv_process_options_t *)0x1c28fb;
    run_test_spawn_affinity_cold_7();
  }
  else {
    __nmemb = (uv_process_options_t *)(ulong)uVar3;
    cStack_3c0.__bits[0xe] = 0;
    cStack_3c0.__bits[0xf] = 0;
    cStack_3c0.__bits[0xc] = 0;
    cStack_3c0.__bits[0xd] = 0;
    cStack_3c0.__bits[10] = 0;
    cStack_3c0.__bits[0xb] = 0;
    cStack_3c0.__bits[8] = 0;
    cStack_3c0.__bits[9] = 0;
    cStack_3c0.__bits[6] = 0;
    cStack_3c0.__bits[7] = 0;
    cStack_3c0.__bits[4] = 0;
    cStack_3c0.__bits[5] = 0;
    cStack_3c0.__bits[2] = 0;
    cStack_3c0.__bits[3] = 0;
    cStack_3c0.__bits[0] = 0;
    cStack_3c0.__bits[1] = 0;
    __s = (uv_process_options_t *)0x0;
    puStack_3e8 = (uv_process_options_t *)0x1c271f;
    iVar1 = sched_getaffinity(0,0x80,&cStack_3c0);
    if (iVar1 != 0) {
      puStack_3e8 = (uv_process_options_t *)0x1c2728;
      piVar9 = __errno_location();
      __s = (uv_process_options_t *)(long)*piVar9;
    }
    puStack_3e0 = (uv_process_options_t *)0x0;
    apuStack_3d8[0] = __s;
    if (__s != (uv_process_options_t *)0x0) goto LAB_001c28c8;
    __nmemb = (uv_process_options_t *)(ulong)uVar3;
    puVar8 = (uv_process_options_t *)0x0;
    do {
      if ((puVar8 < (uv_process_options_t *)0x400) &&
         (puVar10 = puVar8,
         (cStack_3c0.__bits[(ulong)puVar8 >> 6] >> ((ulong)puVar8 & 0x3f) & 1) != 0)) break;
      puVar8 = (uv_process_options_t *)((long)&puVar8->exit_cb + 1);
      puVar10 = __nmemb;
    } while (__nmemb != puVar8);
    unaff_R15 = (uv_process_options_t *)((ulong)puVar10 & 0xffffffff);
    puStack_3e0 = __nmemb;
    apuStack_3d8[0] = unaff_R15;
    if (__nmemb <= unaff_R15) goto LAB_001c28d5;
    puStack_3e8 = (uv_process_options_t *)0x1c27a8;
    snprintf((char *)apuStack_3d8,0xb,"%d",unaff_R15);
    puStack_3e8 = (uv_process_options_t *)0x1c27bb;
    init_process_options("spawn_helper_affinity",exit_cb);
    puStack_3e8 = (uv_process_options_t *)0x1c27c8;
    puVar10 = (uv_process_options_t *)calloc((size_t)__nmemb,1);
    puVar8 = __nmemb;
    if (puVar10 == (uv_process_options_t *)0x0) goto LAB_001c28e2;
    *(char *)((long)&unaff_R15->exit_cb + (long)&puVar10->exit_cb) = '\x01';
    puVar8 = &options;
    options.cpumask = (char *)puVar10;
    options.cpumask_size = (size_t)__nmemb;
    options.args[2] = (char *)apuStack_3d8;
    options.args[3] = "dummy";
    puStack_3e8 = (uv_process_options_t *)0x1c2810;
    uVar4 = uv_default_loop();
    puStack_3e8 = (uv_process_options_t *)0x1c2822;
    iVar1 = uv_spawn(uVar4,&process,&options);
    if (iVar1 != 0) goto LAB_001c28e7;
    puStack_3e8 = (uv_process_options_t *)0x1c282f;
    uVar4 = uv_default_loop();
    puStack_3e8 = (uv_process_options_t *)0x1c2839;
    iVar1 = uv_run(uVar4,0);
    if (iVar1 != 0) goto LAB_001c28ec;
    if (exit_cb_called != 1) goto LAB_001c28f1;
    if (close_cb_called != 1) goto LAB_001c28f6;
    puStack_3e8 = (uv_process_options_t *)0x1c2863;
    free(puVar10);
    puStack_3e8 = (uv_process_options_t *)0x1c2868;
    puVar8 = (uv_process_options_t *)uv_default_loop();
    puStack_3e8 = (uv_process_options_t *)0x1c287c;
    uv_walk(puVar8,close_walk_cb,0);
    puStack_3e8 = (uv_process_options_t *)0x1c2886;
    uv_run(puVar8,0);
    puStack_3e0 = (uv_process_options_t *)0x0;
    puStack_3e8 = (uv_process_options_t *)0x1c2893;
    uVar4 = uv_default_loop();
    puStack_3e8 = (uv_process_options_t *)0x1c289b;
    iVar1 = uv_loop_close(uVar4);
    puStack_3c8 = (uv_process_options_t *)(long)iVar1;
    if (puStack_3e0 == puStack_3c8) {
      puStack_3e8 = (uv_process_options_t *)0x1c28b2;
      uv_library_shutdown();
      return 0;
    }
  }
  puStack_3e8 = (uv_process_options_t *)run_test_spawn_affinity_invalid_mask;
  run_test_spawn_affinity_cold_8();
  puStack_410 = (uv_process_options_t *)0x1c2912;
  puStack_3e8 = puVar8;
  iVar1 = uv_cpumask_size();
  if (iVar1 < 1) {
    puStack_410 = (uv_process_options_t *)0x1c29d1;
    run_test_spawn_affinity_invalid_mask_cold_1();
LAB_001c29d1:
    puStack_410 = (uv_process_options_t *)0x1c29d6;
    run_test_spawn_affinity_invalid_mask_cold_2();
LAB_001c29d6:
    puStack_410 = (uv_process_options_t *)0x1c29db;
    run_test_spawn_affinity_invalid_mask_cold_3();
  }
  else {
    puStack_410 = (uv_process_options_t *)0x1c292d;
    init_process_options("",exit_cb);
    options.cpumask = &cStack_3f9;
    cStack_3f9 = '\0';
    options.cpumask_size = 0;
    puVar8 = &options;
    puStack_410 = (uv_process_options_t *)0x1c2953;
    uVar4 = uv_default_loop();
    puStack_410 = (uv_process_options_t *)0x1c2965;
    iVar1 = uv_spawn(uVar4,&process,&options);
    if (iVar1 != -0x16) goto LAB_001c29d1;
    if (exit_cb_called != 0) goto LAB_001c29d6;
    puStack_410 = (uv_process_options_t *)0x1c2978;
    puVar8 = (uv_process_options_t *)uv_default_loop();
    puStack_410 = (uv_process_options_t *)0x1c298c;
    uv_walk(puVar8,close_walk_cb,0);
    puStack_410 = (uv_process_options_t *)0x1c2996;
    uv_run(puVar8,0);
    lStack_3f0 = 0;
    puStack_410 = (uv_process_options_t *)0x1c29a4;
    uVar4 = uv_default_loop();
    puStack_410 = (uv_process_options_t *)0x1c29ac;
    iVar1 = uv_loop_close(uVar4);
    lStack_3f8 = (long)iVar1;
    if (lStack_3f0 == lStack_3f8) {
      puStack_410 = (uv_process_options_t *)0x1c29c4;
      uv_library_shutdown();
      return 0;
    }
  }
  puStack_410 = (uv_process_options_t *)run_test_spawn_auto_unref;
  run_test_spawn_affinity_invalid_mask_cold_4();
  puStack_428 = (uv_process_options_t *)0x1c29fd;
  puStack_410 = puVar8;
  init_process_options("spawn_helper1",(uv_exit_cb)0x0);
  puStack_428 = (uv_process_options_t *)0x1c2a02;
  uVar4 = uv_default_loop();
  puStack_428 = (uv_process_options_t *)0x1c2a18;
  iVar1 = uv_spawn(uVar4,&process,&options);
  lStack_418 = (long)iVar1;
  lStack_420 = 0;
  if (lStack_418 == 0) {
    puStack_428 = (uv_process_options_t *)0x1c2a3b;
    uVar4 = uv_default_loop();
    puStack_428 = (uv_process_options_t *)0x1c2a45;
    iVar1 = uv_run(uVar4,0);
    lStack_418 = (long)iVar1;
    lStack_420 = 0;
    if (lStack_418 != 0) goto LAB_001c2b56;
    puStack_428 = (uv_process_options_t *)0x1c2a6f;
    iVar1 = uv_is_closing(&process);
    lStack_418 = (long)iVar1;
    lStack_420 = 0;
    if (lStack_418 != 0) goto LAB_001c2b63;
    puStack_428 = (uv_process_options_t *)0x1c2a9b;
    uv_close(&process,0);
    puStack_428 = (uv_process_options_t *)0x1c2aa0;
    uVar4 = uv_default_loop();
    puStack_428 = (uv_process_options_t *)0x1c2aaa;
    iVar1 = uv_run(uVar4,0);
    lStack_418 = (long)iVar1;
    lStack_420 = 0;
    if (lStack_418 != 0) goto LAB_001c2b70;
    lStack_418 = 1;
    puStack_428 = (uv_process_options_t *)0x1c2add;
    iVar1 = uv_is_closing(&process);
    lStack_420 = (long)iVar1;
    if (lStack_418 != lStack_420) goto LAB_001c2b7d;
    puStack_428 = (uv_process_options_t *)0x1c2af7;
    puVar8 = (uv_process_options_t *)uv_default_loop();
    puStack_428 = (uv_process_options_t *)0x1c2b0b;
    uv_walk(puVar8,close_walk_cb,0);
    puStack_428 = (uv_process_options_t *)0x1c2b15;
    uv_run(puVar8,0);
    lStack_418 = 0;
    puStack_428 = (uv_process_options_t *)0x1c2b23;
    uVar4 = uv_default_loop();
    puStack_428 = (uv_process_options_t *)0x1c2b2b;
    iVar1 = uv_loop_close(uVar4);
    lStack_420 = (long)iVar1;
    if (lStack_418 == lStack_420) {
      puStack_428 = (uv_process_options_t *)0x1c2b41;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_428 = (uv_process_options_t *)0x1c2b56;
    run_test_spawn_auto_unref_cold_1();
LAB_001c2b56:
    puStack_428 = (uv_process_options_t *)0x1c2b63;
    run_test_spawn_auto_unref_cold_2();
LAB_001c2b63:
    puStack_428 = (uv_process_options_t *)0x1c2b70;
    run_test_spawn_auto_unref_cold_3();
LAB_001c2b70:
    puStack_428 = (uv_process_options_t *)0x1c2b7d;
    run_test_spawn_auto_unref_cold_4();
LAB_001c2b7d:
    puStack_428 = (uv_process_options_t *)0x1c2b8a;
    run_test_spawn_auto_unref_cold_5();
  }
  puStack_428 = (uv_process_options_t *)run_test_spawn_fs_open;
  run_test_spawn_auto_unref_cold_6();
  uStack_898 = 0x6c756e2f7665642f;
  uStack_890 = 0x6c;
  puStack_438 = puVar8;
  puStack_430 = puVar10;
  puStack_428 = unaff_R15;
  iVar1 = uv_fs_open(0,auStack_5f8,&uStack_898,2,0,0);
  alStack_6e0[0] = (long)iVar1;
  alStack_7a8[0] = 0;
  if (alStack_6e0[0] == 0) {
    puVar8 = (uv_process_options_t *)(ulong)uStack_5a0;
    uStack_8b0 = uStack_5a0;
    init_process_options("spawn_helper8",exit_cb);
    uVar4 = uv_default_loop();
    iVar1 = uv_pipe_init(uVar4,(uv_stream_t *)alStack_6e0,0);
    alStack_7a8[0] = (long)iVar1;
    alStack_870[0] = 0;
    if (alStack_7a8[0] != 0) goto LAB_001c2eb0;
    options.stdio = &uStack_888;
    uStack_888.flags = UV_READABLE_PIPE|UV_CREATE_PIPE;
    options.stdio_count = 1;
    uStack_888.data.stream = (uv_stream_t *)alStack_6e0;
    iStack_8ac = dup(uStack_5a0);
    uVar4 = uv_default_loop();
    iVar1 = uv_spawn(uVar4,&process,&options);
    alStack_7a8[0] = (long)iVar1;
    alStack_870[0] = 0;
    if (alStack_7a8[0] != 0) goto LAB_001c2ec2;
    auStack_8a8 = uv_buf_init(&uStack_8b0,4);
    iVar1 = uv_write(alStack_7a8,alStack_6e0,auStack_8a8,1,write_null_cb);
    alStack_870[0] = (long)iVar1;
    if (alStack_870[0] != 0) goto LAB_001c2ed4;
    auVar11 = uv_buf_init(&iStack_8ac,4);
    auStack_8a8 = auVar11;
    iVar1 = uv_write(alStack_870,alStack_6e0,auStack_8a8,1,write_cb);
    lStack_8b8 = 0;
    if (iVar1 != 0) goto LAB_001c2ee3;
    uVar4 = uv_default_loop();
    iVar1 = uv_run(uVar4,0);
    lStack_8b8 = 0;
    if (iVar1 != 0) goto LAB_001c2ef2;
    iVar1 = uv_fs_close(0,auStack_5f8,uStack_8b0,0);
    lStack_8b8 = 0;
    if (iVar1 != 0) goto LAB_001c2f01;
    lStack_8b8 = (long)exit_cb_called;
    if (lStack_8b8 != 1) goto LAB_001c2f10;
    lStack_8b8 = (long)close_cb_called;
    if (lStack_8b8 != 2) goto LAB_001c2f1f;
    puVar8 = (uv_process_options_t *)uv_default_loop();
    uv_walk(puVar8,close_walk_cb,0);
    uv_run(puVar8,0);
    uVar4 = uv_default_loop();
    iVar1 = uv_loop_close(uVar4);
    lStack_8b8 = (long)iVar1;
    if (lStack_8b8 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_spawn_fs_open_cold_1();
LAB_001c2eb0:
    run_test_spawn_fs_open_cold_2();
LAB_001c2ec2:
    run_test_spawn_fs_open_cold_3();
LAB_001c2ed4:
    run_test_spawn_fs_open_cold_4();
LAB_001c2ee3:
    run_test_spawn_fs_open_cold_5();
LAB_001c2ef2:
    run_test_spawn_fs_open_cold_6();
LAB_001c2f01:
    run_test_spawn_fs_open_cold_7();
LAB_001c2f10:
    run_test_spawn_fs_open_cold_8();
LAB_001c2f1f:
    run_test_spawn_fs_open_cold_9();
  }
  iVar1 = (int)&lStack_8b8;
  run_test_spawn_fs_open_cold_10();
  if (iVar1 == 0) {
    return 0;
  }
  write_null_cb_cold_1();
  puStack_8f0 = puVar8;
  auStack_c00._24_16_ = uv_buf_init("",1);
  iVar1 = uv_pipe(auStack_c00 + 0x10,0,0);
  if (iVar1 == 0) {
    init_process_options("spawn_helper4",exit_cb);
    options.stdio_count = 3;
    options.stdio = &uStack_928;
    uStack_928.flags = UV_INHERIT_FD;
    uStack_928.data.file = auStack_c00._16_4_;
    uStack_918 = 0;
    uStack_908 = 0;
    uVar4 = uv_default_loop();
    iVar1 = uv_spawn(uVar4,&process,&options);
    apuStack_bd0[0] = (uv_handle_t *)(long)iVar1;
    auStack_a10[0] = 0;
    if (apuStack_bd0[0] != (uv_handle_t *)0x0) goto LAB_001c33eb;
    uv_unref(&process);
    uVar4 = uv_default_loop();
    iVar1 = uv_pipe_init(uVar4,auStack_a10,0);
    apuStack_bd0[0] = (uv_handle_t *)(long)iVar1;
    auStack_c00._0_8_ = (uv_loop_t *)0x0;
    if (apuStack_bd0[0] != (uv_handle_t *)0x0) goto LAB_001c33fd;
    iVar1 = uv_pipe_open(auStack_a10,auStack_c00._16_4_);
    apuStack_bd0[0] = (uv_handle_t *)(long)iVar1;
    auStack_c00._0_8_ = (uv_loop_t *)0x0;
    if (apuStack_bd0[0] != (uv_handle_t *)0x0) goto LAB_001c340c;
    auStack_c00._16_4_ = ~UV_UNKNOWN_HANDLE;
    iVar1 = uv_read_start(auStack_a10,on_alloc,on_read_once);
    apuStack_bd0[0] = (uv_handle_t *)(long)iVar1;
    auStack_c00._0_8_ = (uv_loop_t *)0x0;
    if (apuStack_bd0[0] != (uv_handle_t *)0x0) goto LAB_001c341b;
    auStack_c00._0_8_ = (uv_loop_t *)0x1;
    iVar1 = uv_fs_write(0,apuStack_bd0,auStack_c00._20_4_,auStack_c00 + 0x18,1,0xffffffffffffffff,0)
    ;
    auStack_c00._8_8_ = SEXT48(iVar1);
    if (auStack_c00._0_8_ != auStack_c00._8_8_) goto LAB_001c342a;
    auStack_c00._0_8_ = (uv_loop_t *)0x1;
    auStack_c00._8_8_ = puStack_b78;
    if (puStack_b78 != (uv_loop_t *)0x1) goto LAB_001c3439;
    uv_fs_req_cleanup(apuStack_bd0);
    uVar4 = uv_default_loop();
    iVar1 = uv_run(uVar4,1);
    auStack_c00._0_8_ = SEXT48(iVar1);
    auStack_c00._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_c00._0_8_ != (uv_loop_t *)0x0) goto LAB_001c3448;
    auStack_c00._0_8_ = (uv_loop_t *)0x1;
    auStack_c00._8_8_ = SEXT48(output_used);
    if ((uv_loop_t *)auStack_c00._8_8_ != (uv_loop_t *)0x1) goto LAB_001c3457;
    uv_close(auStack_a10,close_cb);
    auStack_c00._0_8_ = (uv_loop_t *)0x1;
    iVar1 = uv_fs_write(0,apuStack_bd0,auStack_c00._20_4_,auStack_c00 + 0x18,1,0xffffffffffffffff,0)
    ;
    auStack_c00._8_8_ = SEXT48(iVar1);
    if (auStack_c00._0_8_ != auStack_c00._8_8_) goto LAB_001c3466;
    auStack_c00._0_8_ = (uv_loop_t *)0x1;
    auStack_c00._8_8_ = puStack_b78;
    if (puStack_b78 != (uv_loop_t *)0x1) goto LAB_001c3475;
    uv_fs_req_cleanup(apuStack_bd0);
    uVar4 = uv_default_loop();
    iVar1 = uv_timer_init(uVar4,&timer);
    auStack_c00._0_8_ = SEXT48(iVar1);
    auStack_c00._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_c00._0_8_ != (uv_loop_t *)0x0) goto LAB_001c3484;
    iVar1 = uv_timer_start(&timer,timer_counter_cb,10,0);
    auStack_c00._0_8_ = SEXT48(iVar1);
    auStack_c00._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_c00._0_8_ != (uv_loop_t *)0x0) goto LAB_001c3493;
    uVar4 = uv_default_loop();
    iVar1 = uv_run(uVar4,1);
    if (iVar1 == 1) {
      uVar4 = uv_default_loop();
      iVar1 = uv_run(uVar4,1);
      auStack_c00._0_8_ = SEXT48(iVar1);
      auStack_c00._8_8_ = (uv_loop_t *)0x0;
      if ((uv_loop_t *)auStack_c00._0_8_ != (uv_loop_t *)0x0) goto LAB_001c34de;
    }
    auStack_c00._0_8_ = (uv_loop_t *)0x1;
    auStack_c00._8_8_ = SEXT48(timer_counter);
    if ((uv_loop_t *)auStack_c00._8_8_ != (uv_loop_t *)0x1) goto LAB_001c34a2;
    iVar1 = uv_process_kill(&process,0xf);
    auStack_c00._0_8_ = SEXT48(iVar1);
    auStack_c00._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_c00._0_8_ != (uv_loop_t *)0x0) goto LAB_001c34b1;
    iVar1 = close(auStack_c00._20_4_);
    auStack_c00._0_8_ = SEXT48(iVar1);
    auStack_c00._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_c00._0_8_ != (uv_loop_t *)0x0) goto LAB_001c34c0;
    auStack_c00._20_4_ = -1;
    uVar4 = uv_default_loop();
    uv_walk(uVar4,close_walk_cb,0);
    uv_run(uVar4,0);
    auStack_c00._0_8_ = (uv_loop_t *)0x0;
    uVar4 = uv_default_loop();
    iVar1 = uv_loop_close(uVar4);
    auStack_c00._8_8_ = SEXT48(iVar1);
    if (auStack_c00._0_8_ == auStack_c00._8_8_) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_closed_fd_events_cold_1();
LAB_001c33eb:
    run_test_closed_fd_events_cold_2();
LAB_001c33fd:
    run_test_closed_fd_events_cold_3();
LAB_001c340c:
    run_test_closed_fd_events_cold_4();
LAB_001c341b:
    run_test_closed_fd_events_cold_5();
LAB_001c342a:
    run_test_closed_fd_events_cold_6();
LAB_001c3439:
    run_test_closed_fd_events_cold_7();
LAB_001c3448:
    run_test_closed_fd_events_cold_8();
LAB_001c3457:
    run_test_closed_fd_events_cold_9();
LAB_001c3466:
    run_test_closed_fd_events_cold_10();
LAB_001c3475:
    run_test_closed_fd_events_cold_11();
LAB_001c3484:
    run_test_closed_fd_events_cold_12();
LAB_001c3493:
    run_test_closed_fd_events_cold_13();
LAB_001c34a2:
    run_test_closed_fd_events_cold_15();
LAB_001c34b1:
    run_test_closed_fd_events_cold_16();
LAB_001c34c0:
    run_test_closed_fd_events_cold_17();
  }
  run_test_closed_fd_events_cold_18();
LAB_001c34de:
  tcp = (uv_stream_t *)auStack_c00;
  nread = auStack_c00 + 8;
  run_test_closed_fd_events_cold_14();
  uv_read_stop();
  on_read(tcp,(ssize_t)nread,buf);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(spawn_closed_process_io) {
  uv_pipe_t in;
  uv_write_t write_req;
  uv_buf_t buf;
  uv_stdio_container_t stdio[2];
  static char buffer[] = "hello-from-spawn_stdin\n";

  init_process_options("spawn_helper3", exit_cb);

  uv_pipe_init(uv_default_loop(), &in, 0);
  options.stdio = stdio;
  options.stdio[0].flags = UV_CREATE_PIPE | UV_READABLE_PIPE;
  options.stdio[0].data.stream = (uv_stream_t*) &in;
  options.stdio_count = 1;

  close(0); /* Close process stdin. */

  ASSERT_OK(uv_spawn(uv_default_loop(), &process, &options));

  buf = uv_buf_init(buffer, sizeof(buffer));
  ASSERT_OK(uv_write(&write_req, (uv_stream_t*) &in, &buf, 1, write_cb));

  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));

  ASSERT_EQ(1, exit_cb_called);
  ASSERT_EQ(2, close_cb_called); /* process, child stdin */

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}